

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::checkPlausibility
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format,
          ArrayPtr<const_unsigned_char> prefix)

{
  ulong uVar1;
  Plausibility PVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  char *pcVar5;
  ProcessContext *pPVar6;
  ArrayPtr<const_unsigned_char> prefix_00;
  ArrayPtr<const_unsigned_char> prefix_01;
  GlobalErrorReporter in_stack_ffffffffffffff78;
  ProcessContext *pPStack_80;
  ArrayDisposer *local_78;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  PVar2 = isPlausibly(this,format,prefix);
  switch(PVar2) {
  case IMPOSSIBLE:
    prefix_00.size_ = (size_t)prefix.ptr;
    prefix_00.ptr = (uchar *)this;
    guessFormat((CompilerMain *)&stack0xffffffffffffff78,prefix_00);
    if ((char)in_stack_ffffffffffffff78._vptr_GlobalErrorReporter == '\x01') {
      uVar1 = (ulong)in_stack_ffffffffffffff78._vptr_GlobalErrorReporter >> 0x20;
      local_70 = (ArrayPtr<const_char>)toString(this,format);
      local_60 = (ArrayPtr<const_char>)toString(this,(Format)uVar1);
      kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[35],kj::StringPtr,char_const(&)[28]>
                ((String *)&stack0xffffffffffffff78,(kj *)"The input is not in \"",
                 (char (*) [22])&stack0xffffffffffffff90,
                 (StringPtr *)"\" format. It looks like it is in \"",
                 (char (*) [35])&stack0xffffffffffffffa0,(StringPtr *)"\" format. Try that instead."
                 ,(char (*) [28])in_stack_ffffffffffffff78._vptr_GlobalErrorReporter);
      (__return_storage_ptr__->errorMessage).ptr.isSet = true;
      *(_func_int ***)&(__return_storage_ptr__->errorMessage).ptr.field_1 =
           in_stack_ffffffffffffff78._vptr_GlobalErrorReporter;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = (size_t)pPStack_80;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_78;
    }
    else {
      local_70 = (ArrayPtr<const_char>)toString(this,format);
      kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[10]>
                ((String *)&stack0xffffffffffffff78,(kj *)"The input is not in \"",
                 (char (*) [22])&stack0xffffffffffffff90,(StringPtr *)"\" format.",
                 (char (*) [10])&stack0xffffffffffffff90);
      (__return_storage_ptr__->errorMessage).ptr.isSet = true;
      *(_func_int ***)&(__return_storage_ptr__->errorMessage).ptr.field_1 =
           in_stack_ffffffffffffff78._vptr_GlobalErrorReporter;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = (size_t)pPStack_80;
      (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_78;
    }
    kj::Array<char>::~Array((Array<char> *)&stack0xffffffffffffff78);
    return __return_storage_ptr__;
  case IMPLAUSIBLE:
    prefix_01.size_ = (size_t)prefix.ptr;
    prefix_01.ptr = (uchar *)this;
    guessFormat((CompilerMain *)&stack0xffffffffffffff78,prefix_01);
    if ((char)in_stack_ffffffffffffff78._vptr_GlobalErrorReporter == '\x01') {
      uVar1 = (ulong)in_stack_ffffffffffffff78._vptr_GlobalErrorReporter >> 0x20;
      pPVar6 = this->context;
      local_70 = (ArrayPtr<const_char>)toString(this,format);
      local_60 = (ArrayPtr<const_char>)toString(this,(Format)uVar1);
      local_50 = (undefined1  [16])toString(this,format);
      local_40 = (undefined1  [16])toString(this,format);
      kj::
      str<char_const(&)[58],kj::StringPtr,char_const(&)[39],kj::StringPtr,char_const(&)[36],kj::StringPtr,char_const(&)[57],kj::StringPtr,char_const(&)[70]>
                ((String *)&stack0xffffffffffffff78,
                 (kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
                 (char (*) [58])&stack0xffffffffffffff90,
                 (StringPtr *)"\" format. It\nlooks like it may be in \"",
                 (char (*) [39])&stack0xffffffffffffffa0,
                 (StringPtr *)"\" format. I\'ll try to parse\nit in \"",
                 (char (*) [36])&stack0xffffffffffffffb0,
                 (StringPtr *)"\" format as you requested, but if it doesn\'t work,\ntry \"",
                 (char (*) [57])&stack0xffffffffffffffc0,
                 (StringPtr *)
                 "\" instead. Use --quiet to suppress this warning.\n*** END WARNING ***\n",
                 (char (*) [70])in_stack_ffffffffffffff78._vptr_GlobalErrorReporter);
      if (pPStack_80 == (ProcessContext *)0x0) {
        in_stack_ffffffffffffff78._vptr_GlobalErrorReporter = (_func_int **)0x20b013;
      }
      (*pPVar6->_vptr_ProcessContext[2])
                (pPVar6,in_stack_ffffffffffffff78._vptr_GlobalErrorReporter,
                 (long)&pPStack_80->_vptr_ProcessContext +
                 (ulong)(pPStack_80 == (ProcessContext *)0x0));
    }
    else {
      pPVar6 = this->context;
      local_70 = (ArrayPtr<const_char>)toString(this,format);
      local_60 = (ArrayPtr<const_char>)toString(this,format);
      kj::str<char_const(&)[58],kj::StringPtr,char_const(&)[67],kj::StringPtr,char_const(&)[94]>
                ((String *)&stack0xffffffffffffff78,
                 (kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
                 (char (*) [58])&stack0xffffffffffffff90,
                 (StringPtr *)
                 "\" format, nor\nin any other known format. I\'ll try to parse it in \"",
                 (char (*) [67])&stack0xffffffffffffffa0,
                 (StringPtr *)
                 "\"\nformat anyway, as you requested. Use --quiet to suppress this warning.\n*** END WARNING ***\n"
                 ,(char (*) [94])in_stack_ffffffffffffff78._vptr_GlobalErrorReporter);
      if (pPStack_80 == (ProcessContext *)0x0) {
        in_stack_ffffffffffffff78._vptr_GlobalErrorReporter = (_func_int **)0x20b013;
      }
      (*pPVar6->_vptr_ProcessContext[2])
                (pPVar6,in_stack_ffffffffffffff78._vptr_GlobalErrorReporter,
                 (long)&pPStack_80->_vptr_ProcessContext +
                 (ulong)(pPStack_80 == (ProcessContext *)0x0));
    }
    kj::Array<char>::~Array((Array<char> *)&stack0xffffffffffffff78);
    break;
  case WRONG_TYPE:
    if (format == FLAT_PACKED) {
      PVar2 = isPlausiblyPacked(this,prefix);
      if ((PVar2 & ~IMPLAUSIBLE) != WRONG_TYPE) goto LAB_0011e317;
      pPVar6 = this->context;
      pp_Var3 = pPVar6->_vptr_ProcessContext;
      pcVar5 = 
      "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat-packed\"\nformat; indeed, it looks like this input may be in regular packed format,\nso you might want to try \"packed\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
      ;
      uVar4 = 0x1ae;
    }
    else if ((format == FLAT) &&
            (PVar2 = isPlausiblyBinary(this,prefix), (PVar2 & ~IMPLAUSIBLE) == WRONG_TYPE)) {
      pPVar6 = this->context;
      pp_Var3 = pPVar6->_vptr_ProcessContext;
      pcVar5 = 
      "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat\"\nformat; indeed, it looks like this input may be in regular binary format,\nso you might want to try \"binary\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
      ;
      uVar4 = 0x1a7;
    }
    else {
LAB_0011e317:
      pPVar6 = this->context;
      pp_Var3 = pPVar6->_vptr_ProcessContext;
      pcVar5 = 
      "*** WARNING ***\nThe input data does not appear to be the type that you specified.  I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right type.  Use --quiet to suppress this warning.\n*** END WARNING ***\n"
      ;
      uVar4 = 0xf6;
    }
    (*pp_Var3[2])(pPVar6,pcVar5,uVar4);
    break;
  case PLAUSIBLE:
    break;
  default:
    kj::_::unreachable();
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity checkPlausibility(Format format, kj::ArrayPtr<const byte> prefix) {
    switch (isPlausibly(format, prefix)) {
      case PLAUSIBLE:
        return true;

      case IMPOSSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          return kj::str(
             "The input is not in \"", toString(format), "\" format. It looks like it is in \"",
             toString(guess), "\" format. Try that instead.");
        } else {
          return kj::str(
             "The input is not in \"", toString(format), "\" format.");
        }

      case IMPLAUSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format. It\n"
              "looks like it may be in \"", toString(guess), "\" format. I'll try to parse\n"
              "it in \"", toString(format), "\" format as you requested, but if it doesn't work,\n"
              "try \"", toString(format), "\" instead. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        } else {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format, nor\n"
              "in any other known format. I'll try to parse it in \"", toString(format), "\"\n"
              "format anyway, as you requested. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        }